

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_tIME(ucvector *out,LodePNGTime *time)

{
  uint uVar1;
  uchar *in_RAX;
  uchar *chunk;
  uchar *local_18;
  
  local_18 = in_RAX;
  uVar1 = lodepng_chunk_init(&local_18,out,7,"tIME");
  if (uVar1 == 0) {
    local_18[8] = *(uchar *)((long)&time->year + 1);
    local_18[9] = (uchar)time->year;
    local_18[10] = (uchar)time->month;
    local_18[0xb] = (uchar)time->day;
    local_18[0xc] = (uchar)time->hour;
    local_18[0xd] = (uchar)time->minute;
    local_18[0xe] = (uchar)time->second;
    lodepng_chunk_generate_crc(local_18);
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_tIME(ucvector* out, const LodePNGTime* time) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 7, "tIME"));
  chunk[8] = (unsigned char)(time->year >> 8);
  chunk[9] = (unsigned char)(time->year & 255);
  chunk[10] = (unsigned char)time->month;
  chunk[11] = (unsigned char)time->day;
  chunk[12] = (unsigned char)time->hour;
  chunk[13] = (unsigned char)time->minute;
  chunk[14] = (unsigned char)time->second;
  lodepng_chunk_generate_crc(chunk);
  return 0;
}